

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::arraySizesCheck
          (TParseContext *this,TSourceLoc *loc,TQualifier *qualifier,TArraySizes *arraySizes,
          TIntermTyped *initializer,bool lastMember)

{
  EShLanguage EVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  char cVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar5;
  _func_int **pp_Var6;
  uint uVar7;
  undefined1 *puVar8;
  
  if (arraySizes == (TArraySizes *)0x0) {
    __assert_fail("arraySizes",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                  ,0x132d,
                  "void glslang::TParseContext::arraySizesCheck(const TSourceLoc &, const TQualifier &, TArraySizes *, const TIntermTyped *, bool)"
                 );
  }
  if ((this->super_TParseContextBase).parsingBuiltins != false) {
    return;
  }
  if (initializer != (TIntermTyped *)0x0) {
    iVar4 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[0x1e])(initializer);
    cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0xf8))
                      ((long *)CONCAT44(extraout_var,iVar4));
    if (cVar2 == '\0') {
      return;
    }
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    (*UNRECOVERED_JUMPTABLE)
              (this,loc,"array initializer must be sized","[]","",UNRECOVERED_JUMPTABLE);
    return;
  }
  bVar3 = TArraySizes::isInnerUnsized(arraySizes);
  if (bVar3) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"only outermost dimension of an array of arrays can be implicitly sized",
               "[]","");
    TArraySizes::clearInnerUnsized(arraySizes);
  }
  bVar3 = TArraySizes::isInnerSpecialization(arraySizes);
  if ((bVar3) &&
     ((7 < (*(uint *)&qualifier->field_0x8 & 0x7f) ||
      ((0x87U >> (*(uint *)&qualifier->field_0x8 & 0x1f) & 1) == 0)))) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "only outermost dimension of an array of arrays can be a specialization constant",
               "[]","");
  }
  if ((this->super_TParseContextBase).super_TParseVersions.profile != EEsProfile) {
    return;
  }
  EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
  if (EVar1 == EShLangTessControl) {
    uVar5 = *(ulong *)&qualifier->field_0x8;
    uVar7 = (uint)uVar5 & 0x7f;
    if (uVar7 != 3) {
      if (uVar7 != 4) goto LAB_0041ac04;
LAB_0041abdc:
      if ((uVar5 >> 0x2c & 1) != 0) goto LAB_0041ac04;
    }
LAB_0041abe3:
    if (0x13f < (this->super_TParseContextBase).super_TParseVersions.version) {
      return;
    }
    pp_Var6 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    puVar8 = AEP_tessellation_shader;
  }
  else {
    if (EVar1 == EShLangTessEvaluation) {
      uVar5 = *(ulong *)&qualifier->field_0x8;
      uVar7 = (uint)uVar5 & 0x7f;
      if (uVar7 != 4) {
        if (uVar7 != 3) goto LAB_0041ac04;
        goto LAB_0041abdc;
      }
      goto LAB_0041abe3;
    }
    if (EVar1 == EShLangMesh) {
      if ((*(uint *)&qualifier->field_0x8 & 0x7f) != 4) goto LAB_0041ac04;
      if (0x13f < (this->super_TParseContextBase).super_TParseVersions.version) {
        return;
      }
      pp_Var6 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      puVar8 = AEP_mesh_shader;
    }
    else {
      if ((EVar1 != EShLangGeometry) || ((*(uint *)&qualifier->field_0x8 & 0x7f) != 3))
      goto LAB_0041ac04;
      if (0x13f < (this->super_TParseContextBase).super_TParseVersions.version) {
        return;
      }
      pp_Var6 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      puVar8 = AEP_geometry_shader;
    }
  }
  iVar4 = (*pp_Var6[9])(this,2,puVar8);
  if ((char)iVar4 != '\0') {
    return;
  }
LAB_0041ac04:
  if ((*(uint *)&qualifier->field_0x8 & 0x7f) == 6 && lastMember) {
    return;
  }
  arraySizeRequiredCheck(this,loc,arraySizes);
  return;
}

Assistant:

void TParseContext::arraySizesCheck(const TSourceLoc& loc, const TQualifier& qualifier, TArraySizes* arraySizes,
    const TIntermTyped* initializer, bool lastMember)
{
    assert(arraySizes);

    // always allow special built-in ins/outs sized to topologies
    if (parsingBuiltins)
        return;

    // initializer must be a sized array, in which case
    // allow the initializer to set any unknown array sizes
    if (initializer != nullptr) {
        if (initializer->getType().isUnsizedArray())
            error(loc, "array initializer must be sized", "[]", "");
        return;
    }

    // No environment allows any non-outer-dimension to be implicitly sized
    if (arraySizes->isInnerUnsized()) {
        error(loc, "only outermost dimension of an array of arrays can be implicitly sized", "[]", "");
        arraySizes->clearInnerUnsized();
    }

    if (arraySizes->isInnerSpecialization() &&
        (qualifier.storage != EvqTemporary && qualifier.storage != EvqGlobal && qualifier.storage != EvqShared && qualifier.storage != EvqConst))
        error(loc, "only outermost dimension of an array of arrays can be a specialization constant", "[]", "");

    // desktop always allows outer-dimension-unsized variable arrays,
    if (!isEsProfile())
        return;

    // for ES, if size isn't coming from an initializer, it has to be explicitly declared now,
    // with very few exceptions

    // implicitly-sized io exceptions:
    switch (language) {
    case EShLangGeometry:
        if (qualifier.storage == EvqVaryingIn)
            if ((isEsProfile() && version >= 320) ||
                extensionsTurnedOn(Num_AEP_geometry_shader, AEP_geometry_shader))
                return;
        break;
    case EShLangTessControl:
        if ( qualifier.storage == EvqVaryingIn ||
            (qualifier.storage == EvqVaryingOut && ! qualifier.isPatch()))
            if ((isEsProfile() && version >= 320) ||
                extensionsTurnedOn(Num_AEP_tessellation_shader, AEP_tessellation_shader))
                return;
        break;
    case EShLangTessEvaluation:
        if ((qualifier.storage == EvqVaryingIn && ! qualifier.isPatch()) ||
             qualifier.storage == EvqVaryingOut)
            if ((isEsProfile() && version >= 320) ||
                extensionsTurnedOn(Num_AEP_tessellation_shader, AEP_tessellation_shader))
                return;
        break;
    case EShLangMesh:
        if (qualifier.storage == EvqVaryingOut)
            if ((isEsProfile() && version >= 320) ||
                extensionsTurnedOn(Num_AEP_mesh_shader, AEP_mesh_shader))
                return;
        break;
    default:
        break;
    }

    // last member of ssbo block exception:
    if (qualifier.storage == EvqBuffer && lastMember)
        return;

    arraySizeRequiredCheck(loc, *arraySizes);
}